

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O0

void AM_drawAuthorMarkers(void)

{
  bool bVar1;
  uint uVar2;
  spritedef_t *psVar3;
  spriteframe_t *psVar4;
  double x;
  double y;
  AActor *local_b0;
  uint local_94;
  AActor *local_90;
  AActor *local_80;
  AActor *marked;
  FActorIterator it_1;
  spriteframe_t *sprframe_1;
  spritedef_t *sprdef;
  spriteframe_t *sprframe;
  FTexture *pFStack_38;
  WORD flip;
  FTexture *tex;
  FTextureID picnum;
  AActor *mark;
  TThinkerIterator<AActor> it;
  
  TThinkerIterator<AActor>::TThinkerIterator((TThinkerIterator<AActor> *)&mark,"MapMarker",0x29);
LAB_0042f810:
  do {
    _picnum = TThinkerIterator<AActor>::Next((TThinkerIterator<AActor> *)&mark,false);
    if (_picnum == (AActor *)0x0) {
      return;
    }
    TFlags<ActorFlag2,_unsigned_int>::operator&
              ((TFlags<ActorFlag2,_unsigned_int> *)((long)&tex + 4),
               (int)_picnum + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&tex + 4));
  } while (uVar2 != 0);
  FTextureID::FTextureID((FTextureID *)&tex);
  sprframe._6_2_ = 0;
  bVar1 = FTextureID::isValid(&_picnum->picnum);
  if (!bVar1) goto LAB_0042f8fc;
  pFStack_38 = FTextureManager::operator()(&TexMan,(FTextureID)(_picnum->picnum).texnum,false);
  if (pFStack_38->Rotations != 0xffff) {
    psVar4 = TArray<spriteframe_t,_spriteframe_t>::operator[]
                       (&SpriteFrames,(ulong)pFStack_38->Rotations);
    tex._0_4_ = psVar4->Texture[0].texnum;
    sprframe._6_2_ = psVar4->Flip & 1;
    pFStack_38 = FTextureManager::operator[](&TexMan,tex._0_4_);
  }
  goto LAB_0042f98f;
LAB_0042f8fc:
  psVar3 = TArray<spritedef_t,_spritedef_t>::operator[](&sprites,(long)_picnum->sprite);
  if (_picnum->frame < psVar3->numframes) {
    psVar4 = TArray<spriteframe_t,_spriteframe_t>::operator[]
                       (&SpriteFrames,(long)(int)((uint)psVar3->spriteframes + (uint)_picnum->frame)
                       );
    it_1._12_4_ = psVar4->Texture[0].texnum;
    sprframe._6_2_ = psVar4->Flip & 1;
    tex._0_4_ = it_1._12_4_;
    pFStack_38 = FTextureManager::operator[](&TexMan,(FTextureID)it_1._12_4_);
LAB_0042f98f:
    FActorIterator::FActorIterator((FActorIterator *)&marked,_picnum->args[0]);
    if (_picnum->args[0] == 0) {
      local_90 = _picnum;
    }
    else {
      local_90 = FActorIterator::Next((FActorIterator *)&marked);
    }
    local_80 = local_90;
    while (local_80 != (AActor *)0x0) {
      if (_picnum->args[1] == 0) {
LAB_0042fa51:
        x = AActor::X(local_80);
        y = AActor::Y(local_80);
        DrawMarker(pFStack_38,x,y,0,(uint)sprframe._6_2_,(_picnum->Scale).X,(_picnum->Scale).Y,
                   _picnum->Translation,_picnum->Alpha,_picnum->fillcolor,_picnum->RenderStyle);
      }
      else if (_picnum->args[1] == 1) {
        if ((hasglnodes & 1U) == 0) {
          local_94 = local_80->Sector->MoreFlags & 0x80;
        }
        else {
          local_94 = local_80->subsector->flags & 2;
        }
        if (local_94 != 0) goto LAB_0042fa51;
      }
      if (_picnum->args[0] == 0) {
        local_b0 = (AActor *)0x0;
      }
      else {
        local_b0 = FActorIterator::Next((FActorIterator *)&marked);
      }
      local_80 = local_b0;
    }
  }
  goto LAB_0042f810;
}

Assistant:

void AM_drawAuthorMarkers ()
{
	// [RH] Draw any actors derived from AMapMarker on the automap.
	// If args[0] is 0, then the actor's sprite is drawn at its own location.
	// Otherwise, its sprite is drawn at the location of any actors whose TIDs match args[0].
	TThinkerIterator<AActor> it ("MapMarker", STAT_MAPMARKER);
	AActor *mark;

	while ((mark = it.Next()) != NULL)
	{
		if (mark->flags2 & MF2_DORMANT)
		{
			continue;
		}

		FTextureID picnum;
		FTexture *tex;
		WORD flip = 0;

		if (mark->picnum.isValid())
		{
			tex = TexMan(mark->picnum);
			if (tex->Rotations != 0xFFFF)
			{
				spriteframe_t *sprframe = &SpriteFrames[tex->Rotations];
				picnum = sprframe->Texture[0];
				flip = sprframe->Flip & 1;
				tex = TexMan[picnum];
			}
		}
		else
		{
			spritedef_t *sprdef = &sprites[mark->sprite];
			if (mark->frame >= sprdef->numframes)
			{
				continue;
			}
			else
			{
				spriteframe_t *sprframe = &SpriteFrames[sprdef->spriteframes + mark->frame];
				picnum = sprframe->Texture[0];
				flip = sprframe->Flip & 1;
				tex = TexMan[picnum];
			}
		}
		FActorIterator it (mark->args[0]);
		AActor *marked = mark->args[0] == 0 ? mark : it.Next();

		while (marked != NULL)
		{
			// Use more correct info if we have GL nodes available
			if (mark->args[1] == 0 ||
				(mark->args[1] == 1 && (hasglnodes ?
				 marked->subsector->flags & SSECF_DRAWN :
				 marked->Sector->MoreFlags & SECF_DRAWN)))
			{
				DrawMarker (tex, marked->X(), marked->Y(), 0, flip, mark->Scale.X, mark->Scale.Y, mark->Translation,
					mark->Alpha, mark->fillcolor, mark->RenderStyle);
			}
			marked = mark->args[0] != 0 ? it.Next() : NULL;
		}
	}
}